

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upath.c
# Opt level: O0

ALLEGRO_PATH * get_executable_name(void)

{
  _Bool _Var1;
  int iVar2;
  ssize_t sVar3;
  ALLEGRO_PATH *pAVar4;
  FILE *__stream;
  char *pcVar5;
  size_t sVar6;
  bool bVar7;
  int len_1;
  char *ret;
  FILE *pipe;
  char command [1024];
  int len;
  stat finfo;
  char filename [1024];
  char linkname [1024];
  pid_t pid;
  ALLEGRO_PATH *path;
  size_t in_stack_fffffffffffff318;
  char *in_stack_fffffffffffff328;
  char *dest;
  int local_ccc;
  char local_cb8 [16];
  char *in_stack_fffffffffffff358;
  int in_stack_fffffffffffff364;
  char *in_stack_fffffffffffff368;
  int in_stack_fffffffffffff374;
  char *in_stack_fffffffffffff378;
  char *in_stack_fffffffffffff488;
  stat local_8a8;
  char local_818 [1024];
  char local_418 [1028];
  uint local_14;
  ALLEGRO_PATH *local_10;
  ALLEGRO_PATH *local_8;
  
  local_14 = getpid();
  sprintf(local_418,"/proc/%d/exe",(ulong)local_14);
  iVar2 = stat(local_418,&local_8a8);
  if (iVar2 == 0) {
    sVar3 = readlink(local_418,local_818,0x3ff);
    if (-1 < (int)sVar3) {
      local_818[(int)sVar3] = '\0';
      pAVar4 = al_create_path(in_stack_fffffffffffff328);
      return pAVar4;
    }
  }
  sprintf(local_cb8,"ps -p %d",(ulong)local_14);
  __stream = popen(local_cb8,"r");
  if (__stream == (FILE *)0x0) {
    local_8 = al_create_path(in_stack_fffffffffffff328);
  }
  else {
    pcVar5 = fgets(local_418,0x400,__stream);
    if ((pcVar5 == (char *)0x0) &&
       (_Var1 = _al_trace_prefix(in_stack_fffffffffffff378,in_stack_fffffffffffff374,
                                 in_stack_fffffffffffff368,in_stack_fffffffffffff364,
                                 in_stack_fffffffffffff358), _Var1)) {
      _al_trace_suffix("Failed to read the name of the executable file.\n");
    }
    sVar6 = strlen(local_418);
    local_ccc = (int)sVar6;
    while( true ) {
      bVar7 = false;
      if (local_418[local_ccc] != ' ') {
        bVar7 = local_418[local_ccc] != '\t';
      }
      if (!bVar7) break;
      local_ccc = local_ccc + -1;
    }
    pcVar5 = fgets(local_418,0x400,__stream);
    if ((pcVar5 == (char *)0x0) &&
       (_Var1 = _al_trace_prefix(in_stack_fffffffffffff378,in_stack_fffffffffffff374,
                                 in_stack_fffffffffffff368,in_stack_fffffffffffff364,
                                 in_stack_fffffffffffff358), _Var1)) {
      _al_trace_suffix("Failed to read the name of the executable file.\n");
    }
    pclose(__stream);
    if (local_418[local_ccc] == '-') {
      local_ccc = local_ccc + 1;
    }
    if ((local_418[local_ccc] == '[') && (sVar6 = strlen(local_418), local_418[sVar6] == ']')) {
      local_ccc = local_ccc + 1;
      sVar6 = strlen(local_418);
      local_418[sVar6] = '\0';
    }
    pcVar5 = local_818;
    dest = local_418 + (long)local_ccc + 1;
    strlen(local_418);
    _al_sane_strncpy(dest,pcVar5,in_stack_fffffffffffff318);
    local_10 = _find_executable_file(in_stack_fffffffffffff488);
    local_8 = local_10;
    if (local_10 == (ALLEGRO_PATH *)0x0) {
      local_8 = al_create_path(dest);
    }
  }
  return local_8;
}

Assistant:

static ALLEGRO_PATH *get_executable_name(void)
{
   ALLEGRO_PATH *path;

   #ifdef ALLEGRO_HAVE_GETEXECNAME
   {
      const char *s = getexecname();
      if (s) {
         if (s[0] == '/') {   /* Absolute path */
            return al_create_path(s);
         }
         else {               /* Not an absolute path */
            path = _find_executable_file(s);
            if (path)
               return path;
         }
      }
   }
   #endif

   /* We need the PID in order to query procfs */
   pid_t pid = getpid();

   /* Try a Linux-like procfs */   
   /* get symolic link to executable from proc fs */
   char linkname[1024];
   char filename[1024];
   struct stat finfo;
   sprintf(linkname, "/proc/%d/exe", (int)pid);
   if (stat(linkname, &finfo) == 0) {
      int len = readlink(linkname, filename, sizeof(filename) - 1);
      if (len > -1) {
         filename[len] = '\0';
         return al_create_path(filename);
      }
   }

   /* Use System V procfs calls if available */
#ifdef ALLEGRO_HAVE_SV_PROCFS_H
   struct prpsinfo psinfo;
   int fd;
   sprintf(linkname, "/proc/%d/exe", (int)pid);
   fd = open(linkname, O_RDONLY);
   if (fd != -1) {
      ioctl(fd, PIOCPSINFO, &psinfo);
      close(fd);
   
      /* Use argv[0] directly if we can */
#ifdef ALLEGRO_HAVE_PROCFS_ARGCV
      if (psinfo.pr_argv && psinfo.pr_argc) {
          path = _find_executable_file(psinfo.pr_argv[0]);
          if (path)
            return path;
      }
      else
#endif
      {
         /* Emulate it */
         /* We use the pr_psargs field to find argv[0]
          * This is better than using the pr_fname field because we need
          * the additional path information that may be present in argv[0]
          */
    
         /* Skip other args */
         char *s = strchr(psinfo.pr_psargs, ' ');
         if (s)
            s[0] = '\0';
         path = _find_executable_file(psinfo.pr_psargs);
         if (path)
            return path;
      }
   
      /* Try the pr_fname just for completeness' sake if argv[0] fails */
      path = _find_executable_file(psinfo.pr_fname);
      if (path)
         return path;
   }
#endif

   /* Last resort: try using the output of the ps command to at least find */
   /* the name of the file if not the full path */
   char command[1024];
   sprintf(command, "ps -p %d", (int)pid);
   FILE *pipe = popen(command, "r");
   if (pipe) {
      char* ret;
      /* The first line of output is a header */
      ret = fgets(linkname, sizeof(linkname), pipe);
      if (!ret)
         ALLEGRO_ERROR("Failed to read the name of the executable file.\n");
      
      /* The information we want is in the last column; find it */
      int len = strlen(linkname);
      while (linkname[len] != ' ' && linkname[len] != '\t')
         len--;

      /* The second line contains the info we want */
      ret = fgets(linkname, sizeof(linkname), pipe);
      if (!ret)
         ALLEGRO_ERROR("Failed to read the name of the executable file.\n");
      pclose(pipe);

      /* Treat special cases: filename between [] and - for login shell */
      if (linkname[len] == '-')
         len++;

      if (linkname[len] == '[' && linkname[strlen(linkname)] == ']') {
         len++;
         linkname[strlen(linkname)] = '\0';
      }         
      
      /* Now, the filename should be in the last column */
      _al_sane_strncpy(filename, linkname+len+1, strlen(linkname)-len+1);

      path = _find_executable_file(filename);
      if (path)
         return path;

      /* Just return the output from ps... */         
      return al_create_path(filename);
   }

   /* Give up; return empty string */
   return al_create_path("");
}